

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroStoreUnaligned
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  undefined4 in_register_0000000c;
  char *text;
  uint in_R8D;
  long lVar1;
  initializer_list<AssemblyTemplateArgument> variables;
  string size;
  string op;
  string macroText;
  pointer local_f8;
  string local_f0 [32];
  char *local_d0;
  string local_c8 [32];
  char *local_a8;
  string local_a0;
  char *local_80;
  string local_78 [32];
  char *local_58;
  string local_50 [32];
  
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  size._M_dataplus._M_p = (pointer)&size.field_2;
  size._M_string_length = 0;
  size.field_2._M_local_buf[0] = '\0';
  if ((in_R8D & 0xf) == 3) {
    text = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\tsb\t\t%rd%,%off%(%rs%)\n\t\t\t\tsrl\t\tr1,%rd%,8\n\t\t\t\tsb\t\tr1,%off%+1(%rs%)\n\t\t\t.endif\n\t\t"
    ;
  }
  else {
    if ((in_R8D & 0xf | 2) != 7) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_00170e00;
    }
    if ((immediates->secondary).type ==
        *(MipsImmediateType *)
         &immediates[1].secondary.expression.expression.
          super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      Logger::printError<>(Error,"Cannot use same register as source and destination");
      std::make_unique<DummyCommand>();
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = local_f8;
      goto LAB_00170e00;
    }
    std::__cxx11::string::assign((char *)&op);
    std::__cxx11::string::assign((char *)&size);
    text = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\t%op%l\t%rd%,%off%+%size%-1(%rs%)\n\t\t\t\t%op%r\t%rd%,%off%(%rs%)\n\t\t\t.endif\n\t\t"
    ;
  }
  preprocessMacro_abi_cxx11_
            (&macroText,text,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_f8 = (pointer)0x18046b;
  std::__cxx11::string::string(local_f0,(string *)&(immediates->primary).expression);
  local_d0 = "%rd%";
  std::__cxx11::string::string(local_c8,(string *)&immediates[1].primary.expression.constExpression)
  ;
  local_a8 = "%off%";
  Expression::toString_abi_cxx11_
            (&local_a0,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->primary).expression);
  local_80 = "%op%";
  std::__cxx11::string::string(local_78,(string *)&op);
  local_58 = "%size%";
  std::__cxx11::string::string(local_50,(string *)&size);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_f8;
  createMacro(parser,(string *)registers,(int)&macroText,variables);
  lVar1 = 0xa8;
  do {
    std::__cxx11::string::~string(local_f0 + lVar1 + -8);
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
LAB_00170e00:
  std::__cxx11::string::~string((string *)&size);
  std::__cxx11::string::~string((string *)&op);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroStoreUnaligned(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	std::string op, size;
	int type = flags & MIPSM_ACCESSMASK;
	if (type == MIPSM_HW)
	{
		const char* templateHalfword = R"(
			.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				sb		%rd%,%off%(%rs%)
				srl		r1,%rd%,8
				sb		r1,%off%+1(%rs%)
			.endif
		)";

		selectedTemplate = templateHalfword;
	} else if (type == MIPSM_W || type == MIPSM_DW)
	{
		const char* templateWord = R"(
			.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				%op%l	%rd%,%off%+%size%-1(%rs%)
				%op%r	%rd%,%off%(%rs%)
			.endif
		)";

		if (registers.grs.num == registers.grd.num)
		{
			Logger::printError(Logger::Error, "Cannot use same register as source and destination");
			return std::make_unique<DummyCommand>();
		}

		op = type == MIPSM_W ? "sw" : "sd";
		size = type == MIPSM_W ? "4" : "8";
		selectedTemplate = templateWord;
	} else {
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rs%",		registers.grs.name.string() },
			{ "%rd%",		registers.grd.name.string() },
			{ "%off%",		immediates.primary.expression.toString() },
			{ "%op%",		op },
			{ "%size%",	size },
	});
}